

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O3

int Dau_DecPerform(word *pInit,int nVars,uint uSet)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int *pSched;
  int iVar4;
  uint uVar5;
  int iVar6;
  int v;
  byte bVar7;
  int nVarsF;
  int nVarsS;
  int nVarsU;
  word *local_8850;
  int pPermC [16];
  int P2V [16];
  int V2P [16];
  int pPermD [16];
  word p [1024];
  word pComp [1024];
  word pDec [1024];
  char pDsdD [5000];
  char pDsdC [5000];
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x30b,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  uVar5 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar5 = 1;
  }
  memcpy(p,pInit,(ulong)uVar5 << 3);
  Dau_DecSortSet(uSet,nVars,&nVarsU,&nVarsS,&nVarsF);
  iVar1 = 0;
  iVar4 = 0;
  local_8850 = pInit;
  if (nVars < 1) {
LAB_0051ef89:
    iVar6 = 0;
    pPermC[iVar4] = nVars;
  }
  else {
    uVar2 = 0;
    do {
      P2V[uVar2] = (int)uVar2;
      V2P[uVar2] = (int)uVar2;
      uVar2 = uVar2 + 1;
    } while ((uint)nVars != uVar2);
    if (nVars < 1) {
      iVar1 = 0;
      iVar4 = 0;
      goto LAB_0051ef89;
    }
    bVar7 = 0;
    iVar4 = 0;
    iVar1 = 0;
    iVar6 = 0;
    do {
      if ((uSet >> (bVar7 & 0x1f) & 3) == 0) {
        Abc_TtMoveVar(p,nVars,V2P,P2V,iVar6,iVar1);
        lVar3 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pPermC[lVar3] = iVar6;
        iVar1 = iVar1 + 1;
      }
      iVar6 = iVar6 + 1;
      bVar7 = bVar7 + 2;
    } while (nVars != iVar6);
    if (nVars < 1) goto LAB_0051ef89;
    bVar7 = 0;
    iVar6 = 0;
    do {
      if ((~(uSet >> (bVar7 & 0x1f)) & 3) == 0) {
        Abc_TtMoveVar(p,nVars,V2P,P2V,iVar6,iVar1);
        lVar3 = (long)iVar4;
        iVar4 = iVar4 + 1;
        pPermC[lVar3] = iVar6;
        iVar1 = iVar1 + 1;
      }
      iVar6 = iVar6 + 1;
      bVar7 = bVar7 + 2;
    } while (nVars != iVar6);
    pPermC[iVar4] = nVars;
    if (nVars < 1) {
      iVar6 = 0;
    }
    else {
      bVar7 = 0;
      iVar6 = 0;
      v = 0;
      do {
        if ((uSet >> (bVar7 & 0x1f) & 3) == 1) {
          Abc_TtMoveVar(p,nVars,V2P,P2V,v,iVar1);
          lVar3 = (long)iVar6;
          iVar6 = iVar6 + 1;
          pPermD[lVar3] = v;
          iVar1 = iVar1 + 1;
        }
        v = v + 1;
        bVar7 = bVar7 + 2;
      } while (nVars != v);
    }
  }
  if (0 < (long)nVarsS) {
    memcpy(pPermD + iVar6,pPermC + nVarsF,(long)nVarsS * 4);
    iVar6 = iVar6 + nVarsS;
  }
  if (iVar6 != nVarsU + nVarsS) {
    __assert_fail("nVarsD == nVarsU + nVarsS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,799,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  if (iVar4 != nVarsF + nVarsS) {
    __assert_fail("nVarsC == nVarsF + nVarsS + 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,800,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  if (iVar1 != nVars) {
    __assert_fail("i == nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x321,"int Dau_DecPerform(word *, int, unsigned int)");
  }
  pSched = Extra_GreyCodeSchedule(iVar6);
  iVar1 = 1 << ((char)iVar6 - 6U & 0x1f);
  if (iVar6 < 7) {
    iVar1 = 1;
  }
  memset(pDec,0,(long)iVar1 << 3);
  iVar1 = 1 << ((char)iVar4 - 5U & 0x1f);
  if (iVar4 < 6) {
    iVar1 = 1;
  }
  memset(pComp,0,(long)iVar1 << 3);
  if (nVarsS == 0) {
    if (5 < nVarsF) {
      nVarsS = 0;
      uVar5 = 0;
      goto LAB_0051f10e;
    }
    nVarsS = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = 0xffffffff >> (-(char)nVarsS & 0x1fU);
    if (5 < nVarsF) {
LAB_0051f10e:
      iVar1 = Dau_DecCheckSetTop6(p,nVars,nVarsF,iVar6,nVarsS,uVar5,pSched,pDec,pComp);
      goto LAB_0051f118;
    }
  }
  iVar1 = Dau_DecCheckSetTop5(p,nVars,nVarsF,iVar6,nVarsS,uVar5,pSched,pDec,pComp);
LAB_0051f118:
  if (pSched != (int *)0x0) {
    free(pSched);
  }
  if (iVar1 == 0) {
    puts("  Decomposition does not exist");
  }
  else {
    Dau_DsdDecompose(pComp,iVar4 + 1,0,1,pDsdC);
    Dau_DsdDecompose(pDec,iVar6,0,1,pDsdD);
    Dau_DecVarReplace(pDsdD,pPermD,iVar6);
    Dau_DecVarReplace(pDsdC,pPermC,iVar4 + 1);
    printf("     ");
    printf("%3d : ",0);
    printf("%24s  ",pDsdD);
    printf("%24s  ",pDsdC);
    Dau_DecVerify(local_8850,nVars,pDsdC,pDsdD);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int Dau_DecPerform( word * pInit, int nVars, unsigned uSet )
{
    word p[1<<10], pDec[1<<10], pComp[1<<10]; // at most 2^10 words
    char pDsdC[5000], pDsdD[5000];  // at most 2^12 hex digits
    int nVarsU, nVarsS, nVarsF, nVarsC = 0, nVarsD = 0;
    int V2P[16], P2V[16], pPermC[16], pPermD[16], * pSched;
    int v, i, status, ResC, ResD;
    int nWords = Abc_TtWordNum(nVars);
    assert( nVars <= 16 );
    // backup the function
    memcpy( p, pInit, sizeof(word) * nWords );
    // get variable numbers
    Dau_DecSortSet( uSet, nVars, &nVarsU, &nVarsS, &nVarsF );
    // permute function and order variables
    for ( v = 0; v < nVars; v++ )
        V2P[v] = P2V[v] = v;
    for ( i = v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 0 ) // free first
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermC[nVarsC++] = v;
    for ( v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 3 ) // share second
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermC[nVarsC++] = v;
    pPermC[nVarsC++] = nVars;
    for ( v = 0; v < nVars; v++ )
        if ( ((uSet >> (v<<1)) & 3) == 1 ) // unique last
           Abc_TtMoveVar( p, nVars, V2P, P2V, v, i++ ), pPermD[nVarsD++] = v;
    for ( v = 0; v < nVarsS; v++ )
        pPermD[nVarsD++] = pPermC[nVarsF+v];
    assert( nVarsD == nVarsU + nVarsS );
    assert( nVarsC == nVarsF + nVarsS + 1 );
    assert( i == nVars );
    // decompose
    pSched = Extra_GreyCodeSchedule( nVarsU + nVarsS );
    memset( pDec, 0, sizeof(word) * Abc_TtWordNum(nVarsD) );
    memset( pComp, 0, sizeof(word) * Abc_TtWordNum(nVarsC) );
    status = Dau_DecCheckSetTop( p, nVars, nVarsF, nVarsU + nVarsS, nVarsS, nVarsS ? Abc_InfoMask(nVarsS) : 0, pSched, pDec, pComp );
    ABC_FREE( pSched );
    if ( !status )
    {
        printf( "  Decomposition does not exist\n" );
        return 0;
    }
//    Dau_DsdPrintFromTruth( stdout, pC, nVars+1 ); //printf( "\n" );
//    Dau_DsdPrintFromTruth( stdout, pD, nVars ); //printf( "\n" );
//    Kit_DsdPrintFromTruth( (unsigned *)pComp, 6 ); printf( "\n" );
//    Kit_DsdPrintFromTruth( (unsigned *)pDec, 6 );  printf( "\n" );
    // decompose
    ResC = Dau_DsdDecompose( pComp, nVarsC, 0, 1, pDsdC );
    ResD = Dau_DsdDecompose( pDec, nVarsD, 0, 1, pDsdD );
    // replace variables
    Dau_DecVarReplace( pDsdD, pPermD, nVarsD );
    Dau_DecVarReplace( pDsdC, pPermC, nVarsC );
    // report
    printf( "     " );
    printf( "%3d : ", 0 );
    printf( "%24s  ", pDsdD );
    printf( "%24s  ", pDsdC );
    Dau_DecVerify( pInit, nVars, pDsdC, pDsdD );
    return 1;
}